

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O3

int uv_tcp_open(uv_tcp_t *handle,uv_os_sock_t sock)

{
  int iVar1;
  
  iVar1 = uv__nonblock_ioctl(sock,1);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv__stream_open((uv_stream_t *)handle,sock,0x60);
  return iVar1;
}

Assistant:

int uv_tcp_open(uv_tcp_t* handle, uv_os_sock_t sock) {
  int err;

  err = uv__nonblock(sock, 1);
  if (err)
    return err;

  return uv__stream_open((uv_stream_t*)handle,
                         sock,
                         UV_STREAM_READABLE | UV_STREAM_WRITABLE);
}